

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::optional<dap::Message>_>::destruct
          (BasicTypeInfo<dap::optional<dap::Message>_> *this,void *ptr)

{
  Message::~Message((Message *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }